

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-store.c
# Opt level: O1

_Bool store_menu_handle(menu *m,ui_event *event,wchar_t oid)

{
  uint uVar1;
  ui_event_type uVar2;
  keycode_t kVar3;
  bool bVar4;
  _Bool _Var5;
  int iVar6;
  wchar_t wVar7;
  store_context *ctx;
  void *pvVar8;
  menu *m_00;
  char *pcVar9;
  byte unaff_BPL;
  byte bVar10;
  byte bVar11;
  char *text;
  cmd_code c;
  uint local_34;
  
  ctx = (store_context *)menu_priv(m);
  uVar2 = event->type;
  if (uVar2 != EVT_KBRD) {
    if (uVar2 == EVT_MOUSE) {
      if (((event->mouse).button != '\x02') && ((event->mouse).button == '\x01')) {
        bVar10 = (event->mouse).y;
        if (bVar10 < 2) {
          bVar11 = (event->mouse).x;
          iVar6 = ctx->store->feat;
          m_00 = menu_dynamic_new();
          pcVar9 = string_make("abcdefghijklmnopqrstuvwxyz");
          m_00->selections = pcVar9;
          menu_dynamic_add_label(m_00,"Inspect inventory",'I',0,pcVar9);
          if (ctx->inspect_only == false) {
            text = "Sell";
            if (iVar6 == 0xe) {
              text = "Stash";
            }
            menu_dynamic_add_label(m_00,text,'d',1,pcVar9);
          }
          menu_dynamic_add_label(m_00,"Exit",'`',5,pcVar9);
          msg_flag = false;
          screen_save();
          local_34 = (uint)bVar10;
          menu_dynamic_calc_location(m_00,(uint)bVar11,local_34);
          region_erase_bordered((region_conflict *)&m_00->boundary);
          bVar4 = false;
          prt("(Enter to select, ESC) Command:",L'\0',L'\0');
          iVar6 = menu_dynamic_select(m_00);
          menu_dynamic_free(m_00);
          string_free(pcVar9);
          screen_load();
          if (iVar6 == 0) {
            textui_obj_examine();
          }
          else {
            if (iVar6 == 5) {
              unaff_BPL = 0;
              goto LAB_001e5d4d;
            }
            if (iVar6 == 1) {
              store_sell(ctx);
            }
          }
LAB_001e5cf1:
          *(byte *)&ctx->flags = (byte)ctx->flags | 3;
          cmdq_pop(CTX_STORE);
          notice_stuff(player);
          handle_stuff(player);
          store_display_recalc(ctx);
          pvVar8 = menu_priv(m);
          menu_setpriv(m,(uint)*(byte *)(*(long *)((long)pvVar8 + 0xb0) + 0x14),pvVar8);
          store_redraw(ctx);
          unaff_BPL = 1;
          bVar4 = false;
        }
        else {
          bVar4 = true;
          if ((L'\xffffffff' < oid) && ((m->active).row + oid == (uint)bVar10)) {
            context_menu_store_item(ctx,oid,(uint)(event->mouse).x,(uint)bVar10);
            goto LAB_001e5cf1;
          }
        }
LAB_001e5d4d:
        if (!bVar4) goto LAB_001e5d54;
      }
    }
    else if (uVar2 == EVT_SELECT) {
      _Var5 = context_menu_store_item(ctx,oid,L'\x01',(m->active).row + oid);
      *(byte *)&ctx->flags = (byte)ctx->flags | 3;
      cmdq_pop(CTX_STORE);
      notice_stuff(player);
      handle_stuff(player);
      unaff_BPL = 1;
      if (_Var5) {
        store_display_recalc(ctx);
        pvVar8 = menu_priv(m);
        menu_setpriv(m,(uint)*(byte *)(*(long *)((long)pvVar8 + 0xb0) + 0x14),pvVar8);
        store_redraw(ctx);
      }
      goto LAB_001e5d54;
    }
    unaff_BPL = 0;
    goto LAB_001e5d54;
  }
  kVar3 = (event->key).code;
  uVar1 = kVar3 - 100;
  if (uVar1 < 0x15) {
    if ((0x1008U >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0x8001U >> (uVar1 & 0x1f) & 1) != 0) {
        store_sell(ctx);
        goto LAB_001e5c7c;
      }
      if ((0x100100U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_001e5b03;
      msg_flag = false;
      prt("Examine which item? (ESC to cancel, Enter to select)",L'\0',L'\0');
      wVar7 = store_get_stock(m,oid);
      prt("",L'\0',L'\0');
      unaff_BPL = 1;
      if (L'\xffffffff' < wVar7) {
        store_examine(ctx,wVar7);
      }
    }
    else {
      msg_flag = false;
      pcVar9 = "Purchase which item? (ESC to cancel, Enter to select)";
      if (ctx->store->feat == 0xe) {
        pcVar9 = "Get which item? (Esc to cancel, Enter to select)";
      }
      prt(pcVar9,L'\0',L'\0');
      wVar7 = store_get_stock(m,oid);
      prt("",L'\0',L'\0');
      unaff_BPL = 1;
      if (L'\xffffffff' < wVar7) {
        store_purchase(ctx,wVar7,false);
      }
    }
    goto switchD_001e5c55_caseD_75;
  }
LAB_001e5b03:
  if (kVar3 == 0x3d) {
    do_cmd_options();
    if ((player->opts).opt[1] == true) {
      m->cmd_keys = "\x04\x05\x10?={|}~CEIPTdegilpswx";
      pcVar9 = "abcfmnoqrtuvyzABDFGHJKLMNOQRSUVWXYZ";
    }
    else {
      m->cmd_keys = "\x05\x10?={|}~CEIbdegiklpstwx";
      pcVar9 = "acfhjmnoqruvyzABDFGHJKLMNOPQRSTUVWXYZ";
    }
    m->selections = pcVar9;
LAB_001e5c7c:
    unaff_BPL = 1;
    goto switchD_001e5c55_caseD_75;
  }
  if (kVar3 == 0x3f) {
    ctx->flags = ctx->flags & 0xfffffffcU ^ 7;
    store_display_recalc(ctx);
    store_redraw(ctx);
    goto LAB_001e5c7c;
  }
  kVar3 = (event->key).code;
  bVar10 = 0;
  prt("",L'\0',L'\0');
  msg_flag = false;
  unaff_BPL = bVar10;
  if ((int)kVar3 < 0x54) {
    if ((int)kVar3 < 0x29) {
      if (kVar3 == 4) goto switchD_001e5d7f_caseD_6b;
      if (kVar3 == 5) {
        toggle_inven_equip();
      }
      else {
        if (kVar3 != 0x10) goto switchD_001e5c55_caseD_75;
        do_cmd_messages();
      }
    }
    else if ((int)kVar3 < 0x49) {
      if (kVar3 == 0x29) {
        do_cmd_save_screen();
      }
      else {
        if (kVar3 != 0x43) goto switchD_001e5c55_caseD_75;
        do_cmd_change_name();
      }
    }
    else {
      if (kVar3 != 0x49) {
        if (kVar3 == 0x50) goto switchD_001e5d7f_caseD_62;
        goto switchD_001e5c55_caseD_75;
      }
      textui_obj_examine();
    }
    goto LAB_001e5e00;
  }
  c = CMD_TAKEOFF;
  bVar11 = 0;
  unaff_BPL = 0;
  switch(kVar3) {
  case 0x74:
    goto switchD_001e5c55_caseD_74;
  case 0x75:
  case 0x76:
  case 0x78:
  case 0x79:
  case 0x7a:
    goto switchD_001e5c55_caseD_75;
  case 0x77:
    c = CMD_WIELD;
    break;
  case 0x7b:
    c = CMD_INSCRIBE;
    break;
  case 0x7c:
    do_cmd_quiver();
    goto LAB_001e5e00;
  case 0x7d:
    c = CMD_UNINSCRIBE;
    break;
  case 0x7e:
    textui_browse_knowledge();
    goto LAB_001e5e00;
  default:
    unaff_BPL = bVar10;
    switch(kVar3) {
    case 0x62:
switchD_001e5d7f_caseD_62:
      textui_spell_browse();
      break;
    case 99:
    case 100:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x6a:
      goto switchD_001e5c55_caseD_75;
    case 0x65:
      do_cmd_equip();
      break;
    case 0x69:
      do_cmd_inven();
      break;
    case 0x6b:
switchD_001e5d7f_caseD_6b:
      textui_cmd_ignore();
      break;
    default:
      bVar11 = bVar10;
      if (kVar3 == 0x54) goto switchD_001e5c55_caseD_74;
      goto switchD_001e5c55_caseD_75;
    }
LAB_001e5e00:
    c = CMD_NULL;
    bVar11 = 1;
    goto switchD_001e5c55_caseD_74;
  }
  bVar11 = 0;
switchD_001e5c55_caseD_74:
  unaff_BPL = 1;
  if (bVar11 == 0) {
    cmdq_push_repeat(c,L'\0');
  }
switchD_001e5c55_caseD_75:
  cmdq_pop(CTX_STORE);
  if (unaff_BPL != 0) {
    event_signal(EVENT_INVENTORY);
    event_signal(EVENT_EQUIPMENT);
  }
  notice_stuff(player);
  handle_stuff(player);
LAB_001e5d54:
  return (_Bool)(unaff_BPL & 1);
}

Assistant:

static bool store_menu_handle(struct menu *m, const ui_event *event, int oid)
{
	bool processed = true;
	struct store_context *ctx = menu_priv(m);
	struct store *store = ctx->store;
	
	if (event->type == EVT_SELECT) {
		/* Hack -- there's no mouse event coordinates to use for */
		/* menu_store_item, so fake one as if mouse clicked on letter */
		bool purchased = context_menu_store_item(ctx, oid, 1, m->active.row + oid);
		ctx->flags |= (STORE_FRAME_CHANGE | STORE_GOLD_CHANGE);

		/* Let the game handle any core commands (equipping, etc) */
		cmdq_pop(CTX_STORE);

		/* Notice and handle stuff */
		notice_stuff(player);
		handle_stuff(player);

		if (purchased) {
			/* Display the store */
			store_display_recalc(ctx);
			store_menu_recalc(m);
			store_redraw(ctx);
		}

		return true;
	} else if (event->type == EVT_MOUSE) {
		if (event->mouse.button == 2) {
			/* exit the store? what already does this? menu_handle_mouse
			 * so exit this so that menu_handle_mouse will be called */
			return false;
		} else if (event->mouse.button == 1) {
			bool action = false;
			if ((event->mouse.y == 0) || (event->mouse.y == 1)) {
				/* show the store context menu */
				if (context_menu_store(ctx, oid, event->mouse.x, event->mouse.y) == false)
					return false;

				action = true;
			} else if ((oid >= 0) && (event->mouse.y == m->active.row + oid)) {
				/* if press is on a list item, so store item context */
				context_menu_store_item(ctx, oid, event->mouse.x,
										event->mouse.y);
				action = true;
			}

			if (action) {
				ctx->flags |= (STORE_FRAME_CHANGE | STORE_GOLD_CHANGE);

				/* Let the game handle any core commands (equipping, etc) */
				cmdq_pop(CTX_STORE);

				/* Notice and handle stuff */
				notice_stuff(player);
				handle_stuff(player);

				/* Display the store */
				store_display_recalc(ctx);
				store_menu_recalc(m);
				store_redraw(ctx);

				return true;
			}
		}
	} else if (event->type == EVT_KBRD) {
		switch (event->key.code) {
			case 's':
			case 'd': store_sell(ctx); break;

			case 'p':
			case 'g':
				/* use the old way of purchasing items */
				msg_flag = false;
				if (store->feat != FEAT_HOME) {
					prt("Purchase which item? (ESC to cancel, Enter to select)",
						0, 0);
				} else {
					prt("Get which item? (Esc to cancel, Enter to select)",
						0, 0);
				}
				oid = store_get_stock(m, oid);
				prt("", 0, 0);
				if (oid >= 0) {
					store_purchase(ctx, oid, false);
				}
				break;
			case 'l':
			case 'x':
				/* use the old way of examining items */
				msg_flag = false;
				prt("Examine which item? (ESC to cancel, Enter to select)",
					0, 0);
				oid = store_get_stock(m, oid);
				prt("", 0, 0);
				if (oid >= 0) {
					store_examine(ctx, oid);
				}
				break;

			case '?': {
				/* Toggle help */
				if (ctx->flags & STORE_SHOW_HELP)
					ctx->flags &= ~(STORE_SHOW_HELP);
				else
					ctx->flags |= STORE_SHOW_HELP;

				/* Redisplay */
				ctx->flags |= STORE_INIT_CHANGE;

				store_display_recalc(ctx);
				store_redraw(ctx);

				break;
			}

			case '=': {
				do_cmd_options();
				store_menu_set_selections(m, false);
				break;
			}

			default:
				processed = store_process_command_key(event->key);
		}

		/* Let the game handle any core commands (equipping, etc) */
		cmdq_pop(CTX_STORE);

		if (processed) {
			event_signal(EVENT_INVENTORY);
			event_signal(EVENT_EQUIPMENT);
		}

		/* Notice and handle stuff */
		notice_stuff(player);
		handle_stuff(player);

		return processed;
	}

	return false;
}